

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::bind_by_name_no_component::test_method(bind_by_name_no_component *this)

{
  socklen_t __len;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  allocator<char> local_198 [8];
  undefined8 local_190;
  shared_count sStack_188;
  undefined **local_180;
  char local_178;
  undefined8 *local_170;
  char *local_168;
  string invalid_name;
  provides<Inject::service> xxx;
  context<0> c;
  char *local_38;
  char *local_30;
  context<0> *pcVar1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c,"s",(allocator<char> *)&invalid_name);
  inject::context<0>::component<Inject::service>::component(&x,(string *)&c);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c,"impl1",(allocator<char> *)&invalid_name);
  inject::context<0>::component<Inject::impl1>::component(&xx,(string *)&c);
  std::__cxx11::string::~string((string *)&c);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  pcVar1 = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = &c;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_name,"this_is_not_a_component_name",(allocator<char> *)&local_180);
  __len = (socklen_t)pcVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"impl1",local_198);
  inject::context<0>::bind(&c,(int)&invalid_name,(sockaddr *)&local_180,__len);
  std::__cxx11::string::~string((string *)&local_180);
  local_38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_30 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0x101);
  local_198[0] = (allocator<char>)0x0;
  local_190 = 0;
  sStack_188.pi_ = (sp_counted_base *)0x0;
  local_178 = '\0';
  local_180 = &PTR__lazy_ostream_0015ffe8;
  local_170 = &boost::unit_test::lazy_ostream::inst;
  local_168 = "no_component not thrown";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_188);
  std::__cxx11::string::~string((string *)&invalid_name);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bind_by_name_no_component)
{
    context<>::component<service> x("s");
    context<>::component<impl1> xx("impl1");
    context<>::component<impl1>::provides<service> xxx;

    context<> c;

    const string invalid_name = "this_is_not_a_component_name";

    try {
        c.bind(invalid_name, "impl1");
        BOOST_ERROR("no_component not thrown");
    } catch (const no_component& e) {
        BOOST_CHECK(e.name() == invalid_name);
        BOOST_CHECK_EQUAL(e.id(), INVALID_ID);
    }
}